

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,longdouble kappa,
          longdouble delta)

{
  longdouble lVar1;
  int iVar2;
  bit_array *pbVar3;
  longdouble *plVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int variable;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar12;
  longdouble in_ST3;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  
  lVar7 = (long)k * 0x10;
  lVar1 = *(longdouble *)(*(long *)(this + 0x78) + lVar7);
  plVar4 = (longdouble *)(*(long *)(this + 0x78) + lVar7);
  lVar12 = kappa / ((longdouble)1 - kappa) + delta;
  variable = (int)x;
  if (selected < 0) {
    *plVar4 = **(longdouble **)(this + 0x60) * (longdouble)0.5 + lVar1;
    lVar13 = in_ST3;
    lVar14 = in_ST3;
    for (lVar5 = 0; (ulong)(uint)r_size << 5 != lVar5; lVar5 = lVar5 + 0x20) {
      iVar2 = *(int *)(*(long *)(this + 0x60) + 0x10 + lVar5);
      bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
      pbVar3 = *(bit_array **)(this + 0x50);
      *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
           *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl - lVar12;
      lVar15 = lVar14;
      solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
      ::local_compute_reduced_cost<baryonyx::bit_array>
                ((longdouble *)this,
                 (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                  *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
      if (in_ST0 <= (longdouble)0) {
        lVar6 = (long)it[iVar2].value * 0x10;
        *(longdouble *)(*(long *)(this + 0x50) + lVar6) =
             (*(longdouble *)(*(long *)(this + 0x50) + lVar6) + in_ST0) - lVar12;
      }
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = lVar13;
      lVar13 = lVar14;
      lVar14 = lVar15;
    }
  }
  else {
    uVar9 = selected + 1;
    lVar13 = *(longdouble *)(*(long *)(this + 0x60) + (ulong)(uint)selected * 0x20);
    if ((int)uVar9 < r_size) {
      uVar8 = (ulong)uVar9 * 0x20;
      *plVar4 = (*(longdouble *)(*(long *)(this + 0x60) + uVar8) + lVar13) * (longdouble)0.5 + lVar1
      ;
      lVar13 = in_ST3;
      lVar14 = in_ST3;
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 0x20) {
        iVar2 = *(int *)(*(long *)(this + 0x60) + 0x10 + uVar10);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        pbVar3 = *(bit_array **)(this + 0x50);
        *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
             lVar12 + *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl;
        lVar15 = lVar14;
        solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
        ::local_compute_reduced_cost<baryonyx::bit_array>
                  ((longdouble *)this,
                   (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                    *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
        if ((longdouble)0 <= in_ST0) {
          lVar5 = (long)it[iVar2].value * 0x10;
          *(longdouble *)(*(long *)(this + 0x50) + lVar5) =
               lVar12 + (*(longdouble *)(*(long *)(this + 0x50) + lVar5) - in_ST0);
        }
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = lVar13;
        lVar13 = lVar14;
        lVar14 = lVar15;
      }
      uVar8 = uVar8 | 0x10;
      lVar5 = (ulong)(uint)r_size - (ulong)uVar9;
      while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
        iVar2 = *(int *)(*(long *)(this + 0x60) + uVar8);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        pbVar3 = *(bit_array **)(this + 0x50);
        *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
             *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl - lVar12;
        lVar15 = lVar14;
        solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
        ::local_compute_reduced_cost<baryonyx::bit_array>
                  ((longdouble *)this,
                   (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                    *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
        if (in_ST0 <= (longdouble)0) {
          lVar6 = (long)it[iVar2].value * 0x10;
          *(longdouble *)(*(long *)(this + 0x50) + lVar6) =
               (*(longdouble *)(*(long *)(this + 0x50) + lVar6) + in_ST0) - lVar12;
        }
        uVar8 = uVar8 + 0x20;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = lVar13;
        lVar13 = lVar14;
        lVar14 = lVar15;
      }
    }
    else {
      *plVar4 = lVar13 * (longdouble)1.5 + lVar1;
      lVar13 = in_ST3;
      lVar14 = in_ST3;
      for (lVar5 = 0; (ulong)(uint)r_size << 5 != lVar5; lVar5 = lVar5 + 0x20) {
        iVar2 = *(int *)(*(long *)(this + 0x60) + 0x10 + lVar5);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        pbVar3 = *(bit_array **)(this + 0x50);
        *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
             lVar12 + *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl;
        lVar15 = lVar14;
        solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
        ::local_compute_reduced_cost<baryonyx::bit_array>
                  ((longdouble *)this,
                   (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                    *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
        if ((longdouble)0 <= in_ST0) {
          lVar6 = (long)it[iVar2].value * 0x10;
          *(longdouble *)(*(long *)(this + 0x50) + lVar6) =
               lVar12 + (*(longdouble *)(*(long *)(this + 0x50) + lVar6) - in_ST0);
        }
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = lVar13;
        lVar13 = lVar14;
        lVar14 = lVar15;
      }
    }
  }
  bVar11 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array>
                     ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                       *)this,k,x);
  if (bVar11) {
    return (bool)((byte)((byte)((unkuint10)lVar1 >> 0x48) ^
                        (byte)((ushort)*(undefined2 *)(*(long *)(this + 0x78) + 8 + lVar7) >> 8)) >>
                 7);
  }
  details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                     ,"436");
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }